

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

void __thiscall
tcmalloc::SymbolizePrinter::DemangleAndPrint
          (SymbolizePrinter *this,uintptr_t pc,char *filename,int lineno,char *function,
          uintptr_t symval)

{
  char *__ptr;
  undefined1 local_78 [8];
  SymbolizeOutcome outcome;
  size_t length;
  int local_38;
  int local_34;
  int status;
  
  local_38 = -1;
  if (function == (char *)0x0) {
    __ptr = (char *)0x0;
    outcome.filename._0_4_ = lineno;
  }
  else {
    local_34 = lineno;
    __ptr = (char *)__cxa_demangle(function,0,&outcome.original_function,&local_38);
    outcome.filename._0_4_ = local_34;
    if (local_38 != 0) {
      tc_free(__ptr);
      __ptr = (char *)0x0;
      outcome.filename._0_4_ = local_34;
    }
  }
  outcome.pc = (uintptr_t)__ptr;
  if (__ptr == (char *)0x0) {
    outcome.pc = (uintptr_t)function;
  }
  local_78 = (undefined1  [8])pc;
  outcome.function = filename;
  outcome._24_8_ = symval;
  outcome.symval = (uintptr_t)function;
  (*(this->outcome_callback_).fn)((SymbolizeOutcome *)local_78,(this->outcome_callback_).data);
  tc_free(__ptr);
  return;
}

Assistant:

void DemangleAndPrint(uintptr_t pc, const char* filename, int lineno, const char* function, uintptr_t symval) {
    char* demangled = nullptr;

#if HAVE_CXA_DEMANGLE
    size_t length;
    int status = -1;
    if (function != nullptr) {
      demangled = __cxxabiv1::__cxa_demangle(function, nullptr, &length, &status);
      if (status != 0) {
        free(demangled);
        demangled = nullptr;
      }
    }
#endif

    SymbolizeOutcome outcome;
    outcome.pc = pc;
    outcome.function = demangled ? demangled : function;
    outcome.original_function = function;
    outcome.filename = filename;
    outcome.lineno = lineno;
    outcome.symval = symval;

    outcome_callback_(outcome);

    free(demangled);
  }